

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char *s,format_specs *specs,locale_ref param_4)

{
  format_specs *pfVar1;
  presentation_type pVar2;
  unsigned_long value;
  locale_ref in_R9;
  basic_string_view<char> s_00;
  locale_ref local_58;
  basic_string_view<char> local_50;
  detail *local_40;
  basic_appender<char> local_38;
  format_specs *local_30;
  format_specs *specs_local;
  char *s_local;
  locale_ref param_3_local;
  basic_appender<char> out_local;
  
  local_30 = specs;
  specs_local = (format_specs *)s;
  s_local = (char *)param_4.locale_;
  param_3_local.locale_ = out.container;
  pVar2 = basic_specs::type(&specs->super_basic_specs);
  if (pVar2 == dec) {
    local_38.container = (buffer<char> *)param_3_local.locale_;
    value = bit_cast<unsigned_long,_const_char_*,_0>((char **)&specs_local);
    out_local = write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                          (local_38,value,local_30);
  }
  else {
    if (specs_local == (format_specs *)0x0) {
      report_error("string pointer is null");
    }
    local_40 = (detail *)param_3_local.locale_;
    basic_string_view<char>::basic_string_view(&local_50,(char *)specs_local);
    pfVar1 = local_30;
    locale_ref::locale_ref(&local_58);
    s_00.size_ = (size_t)pfVar1;
    s_00.data_ = (char *)local_50.size_;
    out_local = write<char,fmt::v11::basic_appender<char>>
                          (local_40,(basic_appender<char>)local_50.data_,s_00,
                           (format_specs *)local_58.locale_,in_R9);
  }
  return (basic_appender<char>)out_local.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s, const format_specs& specs,
                         locale_ref) -> OutputIt {
  if (specs.type() == presentation_type::pointer)
    return write_ptr<Char>(out, bit_cast<uintptr_t>(s), &specs);
  if (!s) report_error("string pointer is null");
  return write<Char>(out, basic_string_view<Char>(s), specs, {});
}